

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_cpuid_x86_64(CPUX86State *env)

{
  void *pvVar1;
  int iVar2;
  uc_struct_conflict *puVar3;
  list_item *plVar4;
  uintptr_t unaff_retaddr;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  
  iVar2 = 0;
  cpu_svm_check_intercept_param_x86_64(env,0x72,0,unaff_retaddr);
  puVar3 = env->uc;
  plVar4 = (list_item *)(puVar3->hook + 1);
  do {
    do {
      do {
        plVar4 = plVar4->next;
        if ((plVar4 == (list_item *)0x0) || (pvVar1 = plVar4->data, pvVar1 == (void *)0x0))
        goto LAB_004d4e16;
      } while (*(char *)((long)pvVar1 + 0x14) != '\0');
    } while ((env->eip < *(ulong *)((long)pvVar1 + 0x18) ||
              *(ulong *)((long)pvVar1 + 0x20) < env->eip) &&
            (*(ulong *)((long)pvVar1 + 0x18) <= *(ulong *)((long)pvVar1 + 0x20)));
    if (*(int *)((long)pvVar1 + 4) == 0x71) {
      iVar2 = (**(code **)((long)pvVar1 + 0x28))(puVar3,*(undefined8 *)((long)pvVar1 + 0x30));
      puVar3 = env->uc;
    }
  } while (puVar3->stop_request != true);
LAB_004d4e16:
  if (iVar2 == 0) {
    cpu_x86_cpuid_x86_64(env,(uint32_t)env->regs[0],(uint32_t)env->regs[1],&eax,&ebx,&ecx,&edx);
    env->regs[0] = (ulong)eax;
    env->regs[3] = (ulong)ebx;
    env->regs[1] = (ulong)ecx;
    env->regs[2] = (ulong)edx;
  }
  return;
}

Assistant:

void helper_cpuid(CPUX86State *env)
{
    uint32_t eax, ebx, ecx, edx;
    struct hook *hook;
    int skip_cpuid = 0;

    cpu_svm_check_intercept_param(env, SVM_EXIT_CPUID, 0, GETPC());

    // Unicorn: call registered CPUID hooks
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        
        // Multiple cpuid callbacks returning different values is undefined.
        // true -> skip the cpuid instruction
        if (hook->insn == UC_X86_INS_CPUID)
            skip_cpuid = ((uc_cb_insn_cpuid_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    if (!skip_cpuid) {
        cpu_x86_cpuid(env, (uint32_t)env->regs[R_EAX], (uint32_t)env->regs[R_ECX],
                    &eax, &ebx, &ecx, &edx);
        env->regs[R_EAX] = eax;
        env->regs[R_EBX] = ebx;
        env->regs[R_ECX] = ecx;
        env->regs[R_EDX] = edx;
    }
    
}